

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

lyd_node * lyd_new_yangdata(lys_module *module,char *name_template,char *name)

{
  int iVar1;
  size_t sVar2;
  lys_node *parent;
  lyd_node *plVar3;
  char *format;
  ly_ctx *ctx;
  lys_node *local_30;
  lys_node *snode;
  
  if ((name_template == (char *)0x0 || module == (lys_module *)0x0) || name == (char *)0x0) {
    format = "Invalid arguments (%s()).";
    name_template = "lyd_new_yangdata";
    ctx = (ly_ctx *)0x0;
  }
  else {
    sVar2 = strlen(name_template);
    parent = lyp_get_yang_data_template(module,name_template,(int)sVar2);
    if (parent != (lys_node *)0x0) {
      sVar2 = strlen(name);
      iVar1 = lys_getnext_data(module,parent,name,(int)sVar2,LYS_CONTAINER,0,&local_30);
      if (iVar1 == 0 && local_30 != (lys_node *)0x0) {
        plVar3 = _lyd_new((lyd_node *)0x0,local_30,0);
        return plVar3;
      }
      ly_log(module->ctx,LY_LLERR,LY_EINVAL,
             "Failed to find \"%s\" as a container child of \"%s:%s\".",name,module->name,
             parent->name);
      return (lyd_node *)0x0;
    }
    ctx = module->ctx;
    format = "Failed to find yang-data template \"%s\".";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,format,name_template);
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_yangdata(const struct lys_module *module, const char *name_template, const char *name)
{
    const struct lys_node *schema = NULL, *snode;

    if (!module || !name_template || !name) {
        LOGARG;
        return NULL;
    }

    schema = lyp_get_yang_data_template(module, name_template, strlen(name_template));
    if (!schema) {
        LOGERR(module->ctx, LY_EINVAL, "Failed to find yang-data template \"%s\".", name_template);
        return NULL;
    }

    if (lys_getnext_data(module, schema, name, strlen(name), LYS_CONTAINER, 0, &snode) || !snode) {
        LOGERR(module->ctx, LY_EINVAL, "Failed to find \"%s\" as a container child of \"%s:%s\".",
               name, module->name, schema->name);
        return NULL;
    }

    return _lyd_new(NULL, snode, 0);
}